

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocate
          (QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  pair<QPersistentModelIndex,_unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_>_*,_std::pair<QPersistentModelIndex,_unsigned_int>_*>
  pVar2;
  pair<QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_>_*,_std::pair<QPersistentModelIndex,_unsigned_int>_*>
  pair;
  pair<QPersistentModelIndex,_unsigned_int> *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocateUnaligned
                    ((QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                     &DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (pair<QPersistentModelIndex,_unsigned_int> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    (in_RDI->first).d = (QPersistentModelIndexData *)pVar2.first;
    *(pair<QPersistentModelIndex,_unsigned_int> **)&in_RDI->second = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }